

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O0

void __thiscall
SQCompiler::ResolveBreaks(SQCompiler *this,SQFuncState *funcstate,SQInteger ntoresolve)

{
  long pos_00;
  longlong *plVar1;
  SQInteger SVar2;
  SQInteger pos;
  SQInteger ntoresolve_local;
  SQFuncState *funcstate_local;
  SQCompiler *this_local;
  
  for (pos = ntoresolve; 0 < pos; pos = pos + -1) {
    plVar1 = sqvector<long_long>::back(&funcstate->_unresolvedbreaks);
    pos_00 = *plVar1;
    sqvector<long_long>::pop_back(&funcstate->_unresolvedbreaks);
    SVar2 = SQFuncState::GetCurrentPos(funcstate);
    SQFuncState::SetIntructionParams(funcstate,pos_00,0,SVar2 - pos_00,0,0);
  }
  return;
}

Assistant:

void ResolveBreaks(SQFuncState *funcstate, SQInteger ntoresolve)
    {
        while(ntoresolve > 0) {
            SQInteger pos = funcstate->_unresolvedbreaks.back();
            funcstate->_unresolvedbreaks.pop_back();
            //set the jmp instruction
            funcstate->SetIntructionParams(pos, 0, funcstate->GetCurrentPos() - pos, 0);
            ntoresolve--;
        }
    }